

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBucket.cpp
# Opt level: O0

void __thiscall
Memory::LargeHeapBucket::Initialize
          (LargeHeapBucket *this,HeapInfo *heapInfo,uint sizeCat,bool supportFreeList)

{
  bool bVar1;
  bool supportFreeList_local;
  uint sizeCat_local;
  HeapInfo *heapInfo_local;
  LargeHeapBucket *this_local;
  
  (this->super_HeapBucket).heapInfo = heapInfo;
  (this->super_HeapBucket).sizeCat = sizeCat;
  bVar1 = HeapInfo::IsPageHeapEnabledForBlock<LargeAllocationBlockAttributes>
                    (heapInfo,(ulong)sizeCat);
  (this->super_HeapBucket).isPageHeapEnabled = bVar1;
  this->supportFreeList = supportFreeList;
  return;
}

Assistant:

void
LargeHeapBucket::Initialize(HeapInfo * heapInfo, uint sizeCat, bool supportFreeList)
{
    this->heapInfo = heapInfo;
    this->sizeCat = sizeCat;
#ifdef RECYCLER_PAGE_HEAP
    this->isPageHeapEnabled = heapInfo->IsPageHeapEnabledForBlock<LargeAllocationBlockAttributes>(sizeCat);
#endif
    this->supportFreeList = supportFreeList;
}